

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int lj_carith_meta(lua_State *L,CTState *cts,CDArith *ca,MMS mm)

{
  uint uVar1;
  GCstr *pGVar2;
  ErrMsg local_160;
  ErrMsg local_15c;
  uint local_14c;
  uint local_144;
  int eq;
  int isstr;
  int isenum;
  int i;
  char *repr [2];
  CType *ct_2;
  CTypeID id_1;
  CType *ct;
  cTValue *pcStack_108;
  CTypeID id;
  cTValue *tv;
  MMS mm_local;
  CDArith *ca_local;
  CTState *cts_local;
  lua_State *L_local;
  CType *local_d8;
  CType *ct_3;
  CType *local_b0;
  CType *ct_1;
  
  pcStack_108 = (cTValue *)0x0;
  if ((int)(L->base->field_4).it >> 0xf == -0xb) {
    ct._4_4_ = (uint)*(ushort *)((L->base->u64 & 0x7fffffffffff) + 10);
    for (local_b0 = cts->tab + ct._4_4_; local_b0->info >> 0x1c == 8;
        local_b0 = cts->tab + (local_b0->info & 0xffff)) {
    }
    if (local_b0->info >> 0x1c == 2) {
      ct._4_4_ = local_b0->info & 0xffff;
    }
    pcStack_108 = lj_ctype_meta(cts,ct._4_4_,mm);
  }
  if (((pcStack_108 == (cTValue *)0x0) && (L->base + 1 < L->top)) &&
     ((int)L->base[1].field_4.it >> 0xf == -0xb)) {
    ct_2._4_4_ = (uint)*(ushort *)((L->base[1].u64 & 0x7fffffffffff) + 10);
    for (local_d8 = cts->tab + ct_2._4_4_; local_d8->info >> 0x1c == 8;
        local_d8 = cts->tab + (local_d8->info & 0xffff)) {
    }
    repr[1] = (char *)local_d8;
    if (local_d8->info >> 0x1c == 2) {
      ct_2._4_4_ = local_d8->info & 0xffff;
    }
    pcStack_108 = lj_ctype_meta(cts,ct_2._4_4_,mm);
  }
  if (pcStack_108 == (cTValue *)0x0) {
    eq = -1;
    local_144 = 0xffffffff;
    if (mm != MM_eq) {
      for (isstr = 0; isstr < 2; isstr = isstr + 1) {
        if ((ca->ct[isstr] == (CType *)0x0) || ((int)L->base[isstr].field_4.it >> 0xf != -0xb)) {
          if ((int)L->base[isstr].field_4.it >> 0xf == -5) {
            local_144 = isstr;
          }
          if ((uint)((int)L->base[isstr].field_4.it >> 0xf) < 0xfffffff3) {
            local_14c = 0xd;
          }
          else {
            local_14c = (int)L->base[isstr].field_4.it >> 0xf ^ 0xffffffff;
          }
          *(char **)(&isenum + (long)isstr * 2) = lj_obj_itypename[local_14c];
        }
        else {
          if (ca->ct[isstr]->info >> 0x1c == 5) {
            eq = isstr;
          }
          pGVar2 = lj_ctype_repr(L,(CTypeID)(((long)ca->ct[isstr] - (long)cts->tab) / 0x18),
                                 (GCstr *)0x0);
          *(GCstr **)(&isenum + (long)isstr * 2) = pGVar2 + 1;
        }
      }
      if ((eq ^ local_144) != 1) {
        if (mm == MM_FAST) {
          local_15c = LJ_ERR_FFI_BADLEN;
        }
        else {
          if (mm == MM_concat) {
            local_160 = LJ_ERR_FFI_BADCONCAT;
          }
          else {
            local_160 = LJ_ERR_FFI_BADARITH;
            if (mm < MM_add) {
              local_160 = LJ_ERR_FFI_BADCOMP;
            }
          }
          local_15c = local_160;
        }
        lj_err_callerv(L,local_15c,_isenum,repr[0]);
      }
      lj_err_callerv(L,LJ_ERR_FFI_BADCONV,*(undefined8 *)(&isenum + (long)(int)local_144 * 2),
                     *(undefined8 *)(&isenum + (long)eq * 2));
    }
    uVar1 = (uint)(ca->p[0] == ca->p[1]);
    L->top[-1].u64 = (long)(int)(uVar1 + 1) << 0x2f ^ 0xffffffffffffffff;
    *(ulong *)((L->glref).ptr64 + 0xf0) = (long)(int)(uVar1 + 1) << 0x2f ^ 0xffffffffffffffff;
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = lj_meta_tailcall(L,pcStack_108);
  }
  return L_local._4_4_;
}

Assistant:

static int lj_carith_meta(lua_State *L, CTState *cts, CDArith *ca, MMS mm)
{
  cTValue *tv = NULL;
  if (tviscdata(L->base)) {
    CTypeID id = cdataV(L->base)->ctypeid;
    CType *ct = ctype_raw(cts, id);
    if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
    tv = lj_ctype_meta(cts, id, mm);
  }
  if (!tv && L->base+1 < L->top && tviscdata(L->base+1)) {
    CTypeID id = cdataV(L->base+1)->ctypeid;
    CType *ct = ctype_raw(cts, id);
    if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
    tv = lj_ctype_meta(cts, id, mm);
  }
  if (!tv) {
    const char *repr[2];
    int i, isenum = -1, isstr = -1;
    if (mm == MM_eq) {  /* Equality checks never raise an error. */
      int eq = ca->p[0] == ca->p[1];
      setboolV(L->top-1, eq);
      setboolV(&G(L)->tmptv2, eq);  /* Remember for trace recorder. */
      return 1;
    }
    for (i = 0; i < 2; i++) {
      if (ca->ct[i] && tviscdata(L->base+i)) {
	if (ctype_isenum(ca->ct[i]->info)) isenum = i;
	repr[i] = strdata(lj_ctype_repr(L, ctype_typeid(cts, ca->ct[i]), NULL));
      } else {
	if (tvisstr(&L->base[i])) isstr = i;
	repr[i] = lj_typename(&L->base[i]);
      }
    }
    if ((isenum ^ isstr) == 1)
      lj_err_callerv(L, LJ_ERR_FFI_BADCONV, repr[isstr], repr[isenum]);
    lj_err_callerv(L, mm == MM_len ? LJ_ERR_FFI_BADLEN :
		      mm == MM_concat ? LJ_ERR_FFI_BADCONCAT :
		      mm < MM_add ? LJ_ERR_FFI_BADCOMP : LJ_ERR_FFI_BADARITH,
		   repr[0], repr[1]);
  }
  return lj_meta_tailcall(L, tv);
}